

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message.cc
# Opt level: O2

void google::protobuf::compiler::cpp::anon_unknown_0::DebugAssertUniformLikelyPresence
               (vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                *fields,Options *options)

{
  FieldDescriptor **ppFVar1;
  bool bVar2;
  __normal_iterator<const_google::protobuf::FieldDescriptor_*const_*,_std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>_>
  __it;
  long lVar3;
  long lVar4;
  __normal_iterator<const_google::protobuf::FieldDescriptor_*const_*,_std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>_>
  _Var5;
  LogMessageFatal local_48;
  Options *local_38;
  
  __it._M_current =
       (fields->
       super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
       )._M_impl.super__Vector_impl_data._M_start;
  ppFVar1 = (fields->
            super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
            )._M_impl.super__Vector_impl_data._M_finish;
  local_38 = options;
  if (__it._M_current == ppFVar1) goto LAB_001f34df;
  local_48.super_LogMessage._0_8_ = &local_38;
  lVar4 = (long)ppFVar1 - (long)__it._M_current;
  local_48.super_LogMessage.data_._M_t.
  super___uniq_ptr_impl<absl::lts_20250127::log_internal::LogMessage::LogMessageData,_std::default_delete<absl::lts_20250127::log_internal::LogMessage::LogMessageData>_>
  ._M_t.
  super__Tuple_impl<0UL,_absl::lts_20250127::log_internal::LogMessage::LogMessageData_*,_std::default_delete<absl::lts_20250127::log_internal::LogMessage::LogMessageData>_>
  .super__Head_base<0UL,_absl::lts_20250127::log_internal::LogMessage::LogMessageData_*,_false>.
  _M_head_impl = (__uniq_ptr_data<absl::lts_20250127::log_internal::LogMessage::LogMessageData,_std::default_delete<absl::lts_20250127::log_internal::LogMessage::LogMessageData>,_true,_true>
                  )(__uniq_ptr_data<absl::lts_20250127::log_internal::LogMessage::LogMessageData,_std::default_delete<absl::lts_20250127::log_internal::LogMessage::LogMessageData>,_true,_true>
                    )fields;
  for (lVar3 = lVar4 >> 5; _Var5._M_current = __it._M_current, 0 < lVar3; lVar3 = lVar3 + -1) {
    bVar2 = __gnu_cxx::__ops::
            _Iter_negate<google::protobuf::compiler::cpp::(anonymous_namespace)::DebugAssertUniform<google::protobuf::compiler::cpp::(anonymous_namespace)::DebugAssertUniformLikelyPresence(std::vector<google::protobuf::FieldDescriptor_const*,std::allocator<google::protobuf::FieldDescriptor_const*>>const&,google::protobuf::compiler::cpp::Options_const&)::$_0>(std::vector<google::protobuf::FieldDescriptor_const*,std::allocator<google::protobuf::FieldDescriptor_const*>>const&,google::protobuf::compiler::cpp::Options_const&,google::protobuf::compiler::cpp::(anonymous_namespace)::DebugAssertUniformLikelyPresence(std::vector<google::protobuf::FieldDescriptor_const*,std::allocator<google::protobuf::FieldDescriptor_const*>>const&,google::protobuf::compiler::cpp::Options_const&)::$_0&&)::{lambda(auto:1_const*)#1}>
            ::operator()((_Iter_negate<google::protobuf::compiler::cpp::(anonymous_namespace)::DebugAssertUniform<google::protobuf::compiler::cpp::(anonymous_namespace)::DebugAssertUniformLikelyPresence(std::vector<google::protobuf::FieldDescriptor_const*,std::allocator<google::protobuf::FieldDescriptor_const*>>const&,google::protobuf::compiler::cpp::Options_const&)::__0>(std::vector<google::protobuf::FieldDescriptor_const*,std::allocator<google::protobuf::FieldDescriptor_const*>>const&,google::protobuf::compiler::cpp::Options_const&,google::protobuf::compiler::cpp::(anonymous_namespace)::DebugAssertUniformLikelyPresence(std::vector<google::protobuf::FieldDescriptor_const*,std::allocator<google::protobuf::FieldDescriptor_const*>>const&,google::protobuf::compiler::cpp::Options_const&)::__0&&)::_lambda(auto:1_const*)_1_>
                          *)&local_48,__it);
    if (bVar2) goto LAB_001f34cb;
    bVar2 = __gnu_cxx::__ops::
            _Iter_negate<google::protobuf::compiler::cpp::(anonymous_namespace)::DebugAssertUniform<google::protobuf::compiler::cpp::(anonymous_namespace)::DebugAssertUniformLikelyPresence(std::vector<google::protobuf::FieldDescriptor_const*,std::allocator<google::protobuf::FieldDescriptor_const*>>const&,google::protobuf::compiler::cpp::Options_const&)::$_0>(std::vector<google::protobuf::FieldDescriptor_const*,std::allocator<google::protobuf::FieldDescriptor_const*>>const&,google::protobuf::compiler::cpp::Options_const&,google::protobuf::compiler::cpp::(anonymous_namespace)::DebugAssertUniformLikelyPresence(std::vector<google::protobuf::FieldDescriptor_const*,std::allocator<google::protobuf::FieldDescriptor_const*>>const&,google::protobuf::compiler::cpp::Options_const&)::$_0&&)::{lambda(auto:1_const*)#1}>
            ::operator()((_Iter_negate<google::protobuf::compiler::cpp::(anonymous_namespace)::DebugAssertUniform<google::protobuf::compiler::cpp::(anonymous_namespace)::DebugAssertUniformLikelyPresence(std::vector<google::protobuf::FieldDescriptor_const*,std::allocator<google::protobuf::FieldDescriptor_const*>>const&,google::protobuf::compiler::cpp::Options_const&)::__0>(std::vector<google::protobuf::FieldDescriptor_const*,std::allocator<google::protobuf::FieldDescriptor_const*>>const&,google::protobuf::compiler::cpp::Options_const&,google::protobuf::compiler::cpp::(anonymous_namespace)::DebugAssertUniformLikelyPresence(std::vector<google::protobuf::FieldDescriptor_const*,std::allocator<google::protobuf::FieldDescriptor_const*>>const&,google::protobuf::compiler::cpp::Options_const&)::__0&&)::_lambda(auto:1_const*)_1_>
                          *)&local_48,
                         (__normal_iterator<const_google::protobuf::FieldDescriptor_*const_*,_std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>_>
                          )(__it._M_current + 1));
    _Var5._M_current = __it._M_current + 1;
    if (bVar2) goto LAB_001f34cb;
    bVar2 = __gnu_cxx::__ops::
            _Iter_negate<google::protobuf::compiler::cpp::(anonymous_namespace)::DebugAssertUniform<google::protobuf::compiler::cpp::(anonymous_namespace)::DebugAssertUniformLikelyPresence(std::vector<google::protobuf::FieldDescriptor_const*,std::allocator<google::protobuf::FieldDescriptor_const*>>const&,google::protobuf::compiler::cpp::Options_const&)::$_0>(std::vector<google::protobuf::FieldDescriptor_const*,std::allocator<google::protobuf::FieldDescriptor_const*>>const&,google::protobuf::compiler::cpp::Options_const&,google::protobuf::compiler::cpp::(anonymous_namespace)::DebugAssertUniformLikelyPresence(std::vector<google::protobuf::FieldDescriptor_const*,std::allocator<google::protobuf::FieldDescriptor_const*>>const&,google::protobuf::compiler::cpp::Options_const&)::$_0&&)::{lambda(auto:1_const*)#1}>
            ::operator()((_Iter_negate<google::protobuf::compiler::cpp::(anonymous_namespace)::DebugAssertUniform<google::protobuf::compiler::cpp::(anonymous_namespace)::DebugAssertUniformLikelyPresence(std::vector<google::protobuf::FieldDescriptor_const*,std::allocator<google::protobuf::FieldDescriptor_const*>>const&,google::protobuf::compiler::cpp::Options_const&)::__0>(std::vector<google::protobuf::FieldDescriptor_const*,std::allocator<google::protobuf::FieldDescriptor_const*>>const&,google::protobuf::compiler::cpp::Options_const&,google::protobuf::compiler::cpp::(anonymous_namespace)::DebugAssertUniformLikelyPresence(std::vector<google::protobuf::FieldDescriptor_const*,std::allocator<google::protobuf::FieldDescriptor_const*>>const&,google::protobuf::compiler::cpp::Options_const&)::__0&&)::_lambda(auto:1_const*)_1_>
                          *)&local_48,
                         (__normal_iterator<const_google::protobuf::FieldDescriptor_*const_*,_std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>_>
                          )(__it._M_current + 2));
    _Var5._M_current = __it._M_current + 2;
    if (bVar2) goto LAB_001f34cb;
    bVar2 = __gnu_cxx::__ops::
            _Iter_negate<google::protobuf::compiler::cpp::(anonymous_namespace)::DebugAssertUniform<google::protobuf::compiler::cpp::(anonymous_namespace)::DebugAssertUniformLikelyPresence(std::vector<google::protobuf::FieldDescriptor_const*,std::allocator<google::protobuf::FieldDescriptor_const*>>const&,google::protobuf::compiler::cpp::Options_const&)::$_0>(std::vector<google::protobuf::FieldDescriptor_const*,std::allocator<google::protobuf::FieldDescriptor_const*>>const&,google::protobuf::compiler::cpp::Options_const&,google::protobuf::compiler::cpp::(anonymous_namespace)::DebugAssertUniformLikelyPresence(std::vector<google::protobuf::FieldDescriptor_const*,std::allocator<google::protobuf::FieldDescriptor_const*>>const&,google::protobuf::compiler::cpp::Options_const&)::$_0&&)::{lambda(auto:1_const*)#1}>
            ::operator()((_Iter_negate<google::protobuf::compiler::cpp::(anonymous_namespace)::DebugAssertUniform<google::protobuf::compiler::cpp::(anonymous_namespace)::DebugAssertUniformLikelyPresence(std::vector<google::protobuf::FieldDescriptor_const*,std::allocator<google::protobuf::FieldDescriptor_const*>>const&,google::protobuf::compiler::cpp::Options_const&)::__0>(std::vector<google::protobuf::FieldDescriptor_const*,std::allocator<google::protobuf::FieldDescriptor_const*>>const&,google::protobuf::compiler::cpp::Options_const&,google::protobuf::compiler::cpp::(anonymous_namespace)::DebugAssertUniformLikelyPresence(std::vector<google::protobuf::FieldDescriptor_const*,std::allocator<google::protobuf::FieldDescriptor_const*>>const&,google::protobuf::compiler::cpp::Options_const&)::__0&&)::_lambda(auto:1_const*)_1_>
                          *)&local_48,
                         (__normal_iterator<const_google::protobuf::FieldDescriptor_*const_*,_std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>_>
                          )(__it._M_current + 3));
    _Var5._M_current = __it._M_current + 3;
    if (bVar2) goto LAB_001f34cb;
    __it._M_current = __it._M_current + 4;
    lVar4 = lVar4 + -0x20;
  }
  lVar4 = lVar4 >> 3;
  if (lVar4 == 1) {
LAB_001f34b7:
    bVar2 = __gnu_cxx::__ops::
            _Iter_negate<google::protobuf::compiler::cpp::(anonymous_namespace)::DebugAssertUniform<google::protobuf::compiler::cpp::(anonymous_namespace)::DebugAssertUniformLikelyPresence(std::vector<google::protobuf::FieldDescriptor_const*,std::allocator<google::protobuf::FieldDescriptor_const*>>const&,google::protobuf::compiler::cpp::Options_const&)::$_0>(std::vector<google::protobuf::FieldDescriptor_const*,std::allocator<google::protobuf::FieldDescriptor_const*>>const&,google::protobuf::compiler::cpp::Options_const&,google::protobuf::compiler::cpp::(anonymous_namespace)::DebugAssertUniformLikelyPresence(std::vector<google::protobuf::FieldDescriptor_const*,std::allocator<google::protobuf::FieldDescriptor_const*>>const&,google::protobuf::compiler::cpp::Options_const&)::$_0&&)::{lambda(auto:1_const*)#1}>
            ::operator()((_Iter_negate<google::protobuf::compiler::cpp::(anonymous_namespace)::DebugAssertUniform<google::protobuf::compiler::cpp::(anonymous_namespace)::DebugAssertUniformLikelyPresence(std::vector<google::protobuf::FieldDescriptor_const*,std::allocator<google::protobuf::FieldDescriptor_const*>>const&,google::protobuf::compiler::cpp::Options_const&)::__0>(std::vector<google::protobuf::FieldDescriptor_const*,std::allocator<google::protobuf::FieldDescriptor_const*>>const&,google::protobuf::compiler::cpp::Options_const&,google::protobuf::compiler::cpp::(anonymous_namespace)::DebugAssertUniformLikelyPresence(std::vector<google::protobuf::FieldDescriptor_const*,std::allocator<google::protobuf::FieldDescriptor_const*>>const&,google::protobuf::compiler::cpp::Options_const&)::__0&&)::_lambda(auto:1_const*)_1_>
                          *)&local_48,__it);
    _Var5._M_current = __it._M_current;
    if (!bVar2) {
      _Var5._M_current = ppFVar1;
    }
  }
  else if (lVar4 == 2) {
LAB_001f34a4:
    bVar2 = __gnu_cxx::__ops::
            _Iter_negate<google::protobuf::compiler::cpp::(anonymous_namespace)::DebugAssertUniform<google::protobuf::compiler::cpp::(anonymous_namespace)::DebugAssertUniformLikelyPresence(std::vector<google::protobuf::FieldDescriptor_const*,std::allocator<google::protobuf::FieldDescriptor_const*>>const&,google::protobuf::compiler::cpp::Options_const&)::$_0>(std::vector<google::protobuf::FieldDescriptor_const*,std::allocator<google::protobuf::FieldDescriptor_const*>>const&,google::protobuf::compiler::cpp::Options_const&,google::protobuf::compiler::cpp::(anonymous_namespace)::DebugAssertUniformLikelyPresence(std::vector<google::protobuf::FieldDescriptor_const*,std::allocator<google::protobuf::FieldDescriptor_const*>>const&,google::protobuf::compiler::cpp::Options_const&)::$_0&&)::{lambda(auto:1_const*)#1}>
            ::operator()((_Iter_negate<google::protobuf::compiler::cpp::(anonymous_namespace)::DebugAssertUniform<google::protobuf::compiler::cpp::(anonymous_namespace)::DebugAssertUniformLikelyPresence(std::vector<google::protobuf::FieldDescriptor_const*,std::allocator<google::protobuf::FieldDescriptor_const*>>const&,google::protobuf::compiler::cpp::Options_const&)::__0>(std::vector<google::protobuf::FieldDescriptor_const*,std::allocator<google::protobuf::FieldDescriptor_const*>>const&,google::protobuf::compiler::cpp::Options_const&,google::protobuf::compiler::cpp::(anonymous_namespace)::DebugAssertUniformLikelyPresence(std::vector<google::protobuf::FieldDescriptor_const*,std::allocator<google::protobuf::FieldDescriptor_const*>>const&,google::protobuf::compiler::cpp::Options_const&)::__0&&)::_lambda(auto:1_const*)_1_>
                          *)&local_48,__it);
    _Var5._M_current = __it._M_current;
    if (!bVar2) {
      __it._M_current = __it._M_current + 1;
      goto LAB_001f34b7;
    }
  }
  else {
    if (lVar4 != 3) {
      return;
    }
    bVar2 = __gnu_cxx::__ops::
            _Iter_negate<google::protobuf::compiler::cpp::(anonymous_namespace)::DebugAssertUniform<google::protobuf::compiler::cpp::(anonymous_namespace)::DebugAssertUniformLikelyPresence(std::vector<google::protobuf::FieldDescriptor_const*,std::allocator<google::protobuf::FieldDescriptor_const*>>const&,google::protobuf::compiler::cpp::Options_const&)::$_0>(std::vector<google::protobuf::FieldDescriptor_const*,std::allocator<google::protobuf::FieldDescriptor_const*>>const&,google::protobuf::compiler::cpp::Options_const&,google::protobuf::compiler::cpp::(anonymous_namespace)::DebugAssertUniformLikelyPresence(std::vector<google::protobuf::FieldDescriptor_const*,std::allocator<google::protobuf::FieldDescriptor_const*>>const&,google::protobuf::compiler::cpp::Options_const&)::$_0&&)::{lambda(auto:1_const*)#1}>
            ::operator()((_Iter_negate<google::protobuf::compiler::cpp::(anonymous_namespace)::DebugAssertUniform<google::protobuf::compiler::cpp::(anonymous_namespace)::DebugAssertUniformLikelyPresence(std::vector<google::protobuf::FieldDescriptor_const*,std::allocator<google::protobuf::FieldDescriptor_const*>>const&,google::protobuf::compiler::cpp::Options_const&)::__0>(std::vector<google::protobuf::FieldDescriptor_const*,std::allocator<google::protobuf::FieldDescriptor_const*>>const&,google::protobuf::compiler::cpp::Options_const&,google::protobuf::compiler::cpp::(anonymous_namespace)::DebugAssertUniformLikelyPresence(std::vector<google::protobuf::FieldDescriptor_const*,std::allocator<google::protobuf::FieldDescriptor_const*>>const&,google::protobuf::compiler::cpp::Options_const&)::__0&&)::_lambda(auto:1_const*)_1_>
                          *)&local_48,__it);
    if (!bVar2) {
      __it._M_current = __it._M_current + 1;
      goto LAB_001f34a4;
    }
  }
LAB_001f34cb:
  if (_Var5._M_current == ppFVar1) {
    return;
  }
LAB_001f34df:
  absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
            (&local_48,
             "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/compiler/cpp/message.cc"
             ,0x68,
             "!fields.empty() && absl::c_all_of(fields, [&](const auto* f) { return pred(f) == pred(fields.front()); })"
            );
  absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal(&local_48);
}

Assistant:

void DebugAssertUniformLikelyPresence(
    const std::vector<const FieldDescriptor*>& fields, const Options& options) {
  DebugAssertUniform(fields, options, [&](const FieldDescriptor* f) {
    return IsLikelyPresent(f, options);
  });
}